

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

Vec_Int_t * Saig_RefManFindReason(Saig_RefMan_t *p)

{
  undefined1 *puVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Cex_t *pAVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *vPrios;
  void *pvVar11;
  Aig_Obj_t *pAVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint local_38;
  
  pVVar10 = Vec_IntStartFull(p->pAig->nTruePis);
  vPrios = Vec_IntStartFull(p->pFrames->vObjs->nSize);
  puVar1 = &p->pFrames->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  iVar9 = 0;
  iVar15 = 1;
  for (iVar14 = 0; pVVar3 = p->pFrames->vCis, iVar14 < pVVar3->nSize; iVar14 = iVar14 + 1) {
    pvVar11 = Vec_PtrEntry(pVVar3,iVar14);
    iVar7 = Vec_IntEntry(p->vMapPiF2A,iVar15 + -1);
    iVar8 = Vec_IntEntry(p->vMapPiF2A,iVar15);
    pAVar4 = p->pCex;
    iVar8 = pAVar4->nRegs + iVar7 + iVar8 * pAVar4->nPis;
    *(ulong *)((long)pvVar11 + 0x18) =
         (*(ulong *)((long)pvVar11 + 0x18) & 0xfffffffffffffff7) +
         (ulong)((uint)(&pAVar4[1].iPo)[iVar8 >> 5] >> ((byte)iVar8 & 0x1f) & 1) * 8;
    iVar8 = Vec_IntEntry(pVVar10,iVar7);
    if (iVar8 == -1) {
      Vec_IntWriteEntry(pVVar10,iVar7,iVar9);
      iVar9 = iVar9 + 1;
    }
    Vec_IntWriteEntry(vPrios,*(int *)((long)pvVar11 + 0x24),iVar14);
    iVar15 = iVar15 + 2;
  }
  Vec_IntFree(pVVar10);
  iVar15 = 0;
  do {
    pVVar3 = p->pFrames->vObjs;
    if (pVVar3->nSize <= iVar15) {
      pAVar12 = Aig_ManCo(p->pFrames,0);
      if ((((uint)pAVar12->pFanin0 ^
           *(uint *)(((ulong)pAVar12->pFanin0 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0) {
        __assert_fail("(int)Aig_ObjFanin0(pObj)->fPhase == Aig_ObjFaninC0(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                      ,0xd5,"Vec_Int_t *Saig_RefManFindReason(Saig_RefMan_t *)");
      }
      pVVar10 = Vec_IntAlloc(100);
      Aig_ManIncrementTravId(p->pFrames);
      iVar15 = Aig_ObjIsConst1((Aig_Obj_t *)((ulong)pAVar12->pFanin0 & 0xfffffffffffffffe));
      if (iVar15 == 0) {
        Saig_RefManFindReason_rec
                  (p->pFrames,(Aig_Obj_t *)((ulong)pAVar12->pFanin0 & 0xfffffffffffffffe),vPrios,
                   pVVar10);
      }
      Vec_IntFree(vPrios);
      return pVVar10;
    }
    pvVar11 = Vec_PtrEntry(pVVar3,iVar15);
    if ((pvVar11 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar11 + 0x18) & 7) - 7)) {
      uVar5 = *(ulong *)((long)pvVar11 + 8);
      iVar9 = -1;
      if (uVar5 != 0) {
        iVar9 = *(int *)((uVar5 & 0xfffffffffffffffe) + 0x24);
      }
      uVar6 = *(ulong *)((long)pvVar11 + 0x10);
      uVar16 = *(uint *)((uVar5 & 0xfffffffffffffffe) + 0x18);
      uVar2 = *(uint *)((uVar6 & 0xfffffffffffffffe) + 0x18);
      iVar14 = Vec_IntEntry(vPrios,iVar9);
      iVar9 = -1;
      if (*(ulong *)((long)pvVar11 + 0x10) != 0) {
        iVar9 = *(int *)((*(ulong *)((long)pvVar11 + 0x10) & 0xfffffffffffffffe) + 0x24);
      }
      uVar17 = (uint)uVar5 & 1;
      uVar16 = uVar16 >> 3 & 1;
      iVar9 = Vec_IntEntry(vPrios,iVar9);
      local_38 = (uint)uVar6;
      local_38 = uVar2 >> 3 ^ local_38;
      bVar13 = (byte)local_38 & uVar17 != uVar16;
      *(ulong *)((long)pvVar11 + 0x18) =
           (*(ulong *)((long)pvVar11 + 0x18) & 0xfffffffffffffff7) + (ulong)bVar13 * 8;
      if (bVar13 == 1) {
        iVar7 = *(int *)((long)pvVar11 + 0x24);
        if (iVar9 < iVar14) {
          iVar9 = iVar14;
        }
      }
      else {
        local_38 = local_38 & 1;
        if ((uVar17 != uVar16) || (local_38 == 0)) {
          if (((uVar17 == uVar16) || (local_38 != 0)) && (iVar14 < iVar9)) {
            iVar9 = iVar14;
          }
          Vec_IntWriteEntry(vPrios,*(int *)((long)pvVar11 + 0x24),iVar9);
          goto LAB_004f46c1;
        }
        iVar7 = *(int *)((long)pvVar11 + 0x24);
        iVar9 = iVar14;
      }
      Vec_IntWriteEntry(vPrios,iVar7,iVar9);
    }
LAB_004f46c1:
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Saig_RefManFindReason( Saig_RefMan_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vPrios, * vPi2Prio, * vReasons;
    int i, CountPrios;

    vPi2Prio = Vec_IntStartFull( Saig_ManPiNum(p->pAig) );
    vPrios   = Vec_IntStartFull( Aig_ManObjNumMax(p->pFrames) );

    // set PI values according to CEX
    CountPrios = 0;
    Aig_ManConst1(p->pFrames)->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        // assign priority
        if ( Vec_IntEntry(vPi2Prio, iInput) == ~0 )
            Vec_IntWriteEntry( vPi2Prio, iInput, CountPrios++ );
//        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Vec_IntEntry(vPi2Prio, iInput) );
        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), i );
    }
//    printf( "Priority numbers = %d.\n", CountPrios );
    Vec_IntFree( vPi2Prio );

    // traverse and set the priority
    Aig_ManForEachNode( p->pFrames, pObj, i )
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        int iPrio0  = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
        int iPrio1  = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
        pObj->fPhase = fPhase0 && fPhase1;
        if ( fPhase0 && fPhase1 ) // both are one
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MaxInt(iPrio0, iPrio1) );
        else if ( !fPhase0 && fPhase1 ) 
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio0 );
        else if ( fPhase0 && !fPhase1 )
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio1 );
        else // both are zero
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MinInt(iPrio0, iPrio1) );
    }
    // check the property output
    pObj = Aig_ManCo( p->pFrames, 0 );
    assert( (int)Aig_ObjFanin0(pObj)->fPhase == Aig_ObjFaninC0(pObj) );

    // select the reason
    vReasons = Vec_IntAlloc( 100 );
    Aig_ManIncrementTravId( p->pFrames );
    if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
        Saig_RefManFindReason_rec( p->pFrames, Aig_ObjFanin0(pObj), vPrios, vReasons );
    Vec_IntFree( vPrios );
    return vReasons;
}